

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_allocator.hpp
# Opt level: O2

data_ptr_t __thiscall
duckdb::FixedSizeAllocator::GetIfLoaded(FixedSizeAllocator *this,IndexPointer ptr)

{
  bool bVar1;
  iterator iVar2;
  pointer pFVar3;
  data_ptr_t pdVar4;
  ulong local_20;
  
  local_20 = ptr.data & 0xffffffff;
  iVar2 = ::std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->buffers)._M_h,&local_20);
  pFVar3 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>::
           operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                       *)((long)iVar2.
                                super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                                ._M_cur + 0x10));
  bVar1 = BufferHandle::IsValid(&pFVar3->buffer_handle);
  if (bVar1) {
    pFVar3 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
             ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                           *)((long)iVar2.
                                    super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                                    ._M_cur + 0x10));
    pdVar4 = FixedSizeBuffer::Get(pFVar3,true);
    pdVar4 = pdVar4 + this->bitmask_offset +
                      (ulong)((uint)(ptr.data >> 0x20) & 0xffffff) * this->segment_size;
  }
  else {
    pdVar4 = (data_ptr_t)0x0;
  }
  return pdVar4;
}

Assistant:

inline data_ptr_t GetIfLoaded(const IndexPointer ptr) {
		D_ASSERT(ptr.GetOffset() < available_segments_per_buffer);
		D_ASSERT(buffers.find(ptr.GetBufferId()) != buffers.end());

		auto &buffer = buffers.find(ptr.GetBufferId())->second;
		if (!buffer->InMemory()) {
			return nullptr;
		}

		auto buffer_ptr = buffer->Get();
		auto raw_ptr = buffer_ptr + ptr.GetOffset() * segment_size + bitmask_offset;
		return raw_ptr;
	}